

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::KNearestNeighborsClassifier::MergePartialFromCodedStream
          (KNearestNeighborsClassifier *this,CodedInputStream *input)

{
  DefaultClassLabelUnion *this_00;
  byte *pbVar1;
  byte bVar2;
  uint8 uVar3;
  byte *pbVar4;
  uint8 *puVar5;
  bool bVar6;
  uint uVar7;
  uint32 uVar8;
  Int64Parameter *this_01;
  ulong extraout_RAX;
  Int64Vector *this_02;
  ulong extraout_RAX_00;
  InverseDistanceWeighting *this_03;
  ulong extraout_RAX_01;
  NearestNeighborsIndex *this_04;
  ulong extraout_RAX_02;
  undefined8 *puVar9;
  StringVector *this_05;
  ulong extraout_RAX_03;
  UniformWeighting *this_06;
  ulong extraout_RAX_04;
  char cVar10;
  ulong uVar11;
  int iVar12;
  pair<unsigned_long,_bool> pVar13;
  int local_4c;
  
  this_00 = &this->DefaultClassLabel_;
  do {
    pbVar4 = input->buffer_;
    uVar8 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
        goto LAB_001e8b79;
        uVar11 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_001e8b79:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar8 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_001e8802;
    uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (uVar7 < 0x6e) {
      if (uVar7 < 100) {
        if (uVar7 == 1) {
          if (cVar10 != '\n') goto LAB_001e8802;
          if (this->nearestneighborsindex_ == (NearestNeighborsIndex *)0x0) {
            this_04 = (NearestNeighborsIndex *)operator_new(0x50);
            NearestNeighborsIndex::NearestNeighborsIndex(this_04);
            this->nearestneighborsindex_ = this_04;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_02;
        }
        else {
          if ((uVar7 != 3) || (cVar10 != '\x1a')) {
LAB_001e8802:
            iVar12 = 7;
            if ((uVar8 & 7) != 4 && uVar8 != 0) {
              bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
              if (bVar6) goto LAB_001e882c;
              iVar12 = 6;
            }
            goto LAB_001e882f;
          }
          if (this->numberofneighbors_ == (Int64Parameter *)0x0) {
            this_01 = (Int64Parameter *)operator_new(0x28);
            Int64Parameter::Int64Parameter(this_01);
            this->numberofneighbors_ = this_01;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX;
        }
      }
      else if (uVar7 == 100) {
        if (cVar10 != '\"') goto LAB_001e8802;
        if (this->_oneof_case_[0] != 100) {
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 100;
          this_05 = (StringVector *)operator_new(0x30);
          StringVector::StringVector(this_05);
          (this->ClassLabels_).stringclasslabels_ = this_05;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_03;
      }
      else {
        if ((uVar7 != 0x65) || (cVar10 != '*')) goto LAB_001e8802;
        if (this->_oneof_case_[0] != 0x65) {
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 0x65;
          this_02 = (Int64Vector *)operator_new(0x28);
          Int64Vector::Int64Vector(this_02);
          (this->ClassLabels_).int64classlabels_ = this_02;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_00;
      }
LAB_001e8b3f:
      iVar12 = local_4c;
      if ((uVar11 & 1) == 0) {
LAB_001e882c:
        iVar12 = 0;
      }
    }
    else {
      if (199 < uVar7) {
        if (uVar7 == 200) {
          if (cVar10 != 'B') goto LAB_001e8802;
          if (this->_oneof_case_[2] != 200) {
            clear_WeightingScheme(this);
            this->_oneof_case_[2] = 200;
            this_06 = (UniformWeighting *)operator_new(0x18);
            UniformWeighting::UniformWeighting(this_06);
            (this->WeightingScheme_).uniformweighting_ = this_06;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_04;
        }
        else {
          if ((uVar7 != 0xd2) || (cVar10 != -0x6e)) goto LAB_001e8802;
          if (this->_oneof_case_[2] != 0xd2) {
            clear_WeightingScheme(this);
            this->_oneof_case_[2] = 0xd2;
            this_03 = (InverseDistanceWeighting *)operator_new(0x18);
            InverseDistanceWeighting::InverseDistanceWeighting(this_03);
            (this->WeightingScheme_).inversedistanceweighting_ = this_03;
          }
          MergePartialFromCodedStream();
          uVar11 = extraout_RAX_01;
        }
        goto LAB_001e8b3f;
      }
      if (uVar7 != 0x6e) {
        if ((uVar7 != 0x6f) || (cVar10 != 'x')) goto LAB_001e8802;
        clear_DefaultClassLabel(this);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar5 + 1;
          pVar13._8_8_ = 1;
          pVar13.first = (long)(char)uVar3;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar12 = 6;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001e882f;
        (this->DefaultClassLabel_).defaultint64label_ = pVar13.first;
        this->_oneof_case_[1] = 0x6f;
        goto LAB_001e882c;
      }
      if (cVar10 != 'r') goto LAB_001e8802;
      if (this->_oneof_case_[1] != 0x6e) {
        clear_DefaultClassLabel(this);
        this->_oneof_case_[1] = 0x6e;
        (this->DefaultClassLabel_).defaultint64label_ =
             (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      }
      if ((undefined8 *)this_00->defaultint64label_ ==
          &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (&this_00->defaultstringlabel_,
                   (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes
                        (input,((string *)*(ArenaStringPtr *)this_00).ptr_);
      iVar12 = 6;
      if (bVar6) {
        puVar9 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        if (this->_oneof_case_[1] == 0x6e) {
          puVar9 = (undefined8 *)(this->DefaultClassLabel_).defaultint64label_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          ((char *)*puVar9,*(int *)(puVar9 + 1),PARSE,
                           "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel");
        if (bVar6) goto LAB_001e882c;
      }
    }
LAB_001e882f:
    if (iVar12 != 0) {
      return iVar12 != 6;
    }
  } while( true );
}

Assistant:

bool KNearestNeighborsClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.KNearestNeighborsClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_nearestneighborsindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_numberofneighbors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string defaultStringLabel = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_defaultstringlabel()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->defaultstringlabel().data(), this->defaultstringlabel().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 defaultInt64Label = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(888u)) {
          clear_DefaultClassLabel();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &DefaultClassLabel_.defaultint64label_)));
          set_has_defaultint64label();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_uniformweighting()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
      case 210: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1682u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inversedistanceweighting()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.KNearestNeighborsClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.KNearestNeighborsClassifier)
  return false;
#undef DO_
}